

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O0

void gauden_norm_wt_fullvar
               (vector_t ****in_var,vector_t ****wt_var,int32 pass2var,float32 ***dnom,
               vector_t ***mean,uint32 n_mgau,uint32 n_feat,uint32 n_density,uint32 *veclen,
               int32 tiedvar)

{
  float32 **local_50;
  vector_t *outermean;
  uint32 ll;
  uint32 l;
  uint32 k;
  uint32 j;
  uint32 i;
  uint32 n_mgau_local;
  vector_t ***mean_local;
  float32 ***dnom_local;
  int32 pass2var_local;
  vector_t ****wt_var_local;
  vector_t ****in_var_local;
  
  if (tiedvar != 0) {
    gauden_tie_fullvars_dnoms(wt_var,pass2var,dnom,mean,n_mgau,n_feat,n_density,veclen);
  }
  for (k = 0; k < n_mgau; k = k + 1) {
    for (l = 0; l < n_feat; l = l + 1) {
      local_50 = (float32 **)0x0;
      if (pass2var == 0) {
        local_50 = (float32 **)
                   __ckd_calloc_2d__((ulong)veclen[l],(ulong)veclen[l],4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                                     ,0x703);
      }
      for (ll = 0; ll < n_density; ll = ll + 1) {
        if (pass2var == 0) {
          outerproduct(local_50,(float32 *)mean[k][l][ll],(float32 *)mean[k][l][ll],veclen[l]);
        }
        if (((float)dnom[k][l][ll] != 0.0) || (NAN((float)dnom[k][l][ll]))) {
          for (outermean._4_4_ = 0; outermean._4_4_ < veclen[l];
              outermean._4_4_ = outermean._4_4_ + 1) {
            for (outermean._0_4_ = 0; (uint)outermean < veclen[l];
                outermean._0_4_ = (uint)outermean + 1) {
              if (pass2var == 0) {
                wt_var[k][l][ll][outermean._4_4_][(uint)outermean] =
                     wt_var[k][l][ll][outermean._4_4_][(uint)outermean] / (float)dnom[k][l][ll] -
                     (float)local_50[outermean._4_4_][(uint)outermean];
              }
              else {
                wt_var[k][l][ll][outermean._4_4_][(uint)outermean] =
                     wt_var[k][l][ll][outermean._4_4_][(uint)outermean] / (float)dnom[k][l][ll];
              }
            }
          }
        }
        else if (in_var != (vector_t ****)0x0) {
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                  ,0x71b,"Copying unseen var (%u, %u, %u) from in_var\n",(ulong)k,(ulong)l,ll);
          for (outermean._4_4_ = 0; outermean._4_4_ < veclen[l];
              outermean._4_4_ = outermean._4_4_ + 1) {
            wt_var[k][l][ll][outermean._4_4_] = in_var[k][l][ll][outermean._4_4_];
          }
        }
      }
      if (pass2var == 0) {
        ckd_free_2d(local_50);
      }
    }
  }
  return;
}

Assistant:

void
gauden_norm_wt_fullvar(vector_t ****in_var,
		       vector_t ****wt_var,
		       int32 pass2var,
		       float32 ***dnom,
		       vector_t ***mean,
		       uint32 n_mgau,
		       uint32 n_feat,
		       uint32 n_density,
		       const uint32 *veclen,
		       int32 tiedvar)
{
    uint32 i, j, k, l, ll;

    if (tiedvar) {
	gauden_tie_fullvars_dnoms(wt_var, pass2var, dnom, mean,
				  n_mgau, n_feat, n_density, veclen);
    }
    for (i = 0; i < n_mgau; i++) {
	for (j = 0; j < n_feat; j++) {
	    vector_t *outermean = NULL;
	    if (!pass2var)
		outermean = (vector_t *)ckd_calloc_2d(veclen[j], veclen[j], sizeof(float32));
		
	    for (k = 0; k < n_density; k++) {
		if (!pass2var)
		    outerproduct(outermean,
				 mean[i][j][k], mean[i][j][k],
				 veclen[j]);
		if (dnom[i][j][k] != 0) {
		    for (l = 0; l < veclen[j]; l++) {
			for (ll = 0; ll < veclen[j]; ll++) {
			    if (!pass2var) {
				wt_var[i][j][k][l][ll] =
				    (wt_var[i][j][k][l][ll] / dnom[i][j][k]) -
				    outermean[l][ll];
			    }
			    else {
				wt_var[i][j][k][l][ll] /= dnom[i][j][k];
			    }
			}
		    }
		}
		else {
		    if (in_var) {
			E_INFO("Copying unseen var (%u, %u, %u) from in_var\n",
			       i, j, k);
			for (l = 0; l < veclen[j]; l++) {
			    wt_var[i][j][k][l] = in_var[i][j][k][l];
			}
		    }
		}
	    }
	    if (!pass2var)
		ckd_free_2d((void **)outermean);
	}
    }
}